

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::InvocationExpressionSyntax::setChild
          (InvocationExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  ArgumentListSyntax *pAVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar5;
  
  ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                      ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child);
  pSVar5 = *ppSVar3;
  if (index == 2) {
    if (pSVar5 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pAVar4 = (ArgumentListSyntax *)0x0;
    }
    else {
      ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pAVar4 = (ArgumentListSyntax *)*ppSVar3;
    }
    this->arguments = pAVar4;
  }
  else if (index == 1) {
    (this->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar5->previewNode;
    uVar2 = *(undefined4 *)&pSVar5->field_0x4;
    pSVar1 = pSVar5->parent;
    (this->attributes).super_SyntaxListBase.super_SyntaxNode.kind = pSVar5->kind;
    *(undefined4 *)&(this->attributes).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->attributes).super_SyntaxListBase.childCount = *(size_t *)(pSVar5 + 1);
    pSVar1 = pSVar5[1].previewNode;
    (this->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
    _M_ptr = (pointer)pSVar5[1].parent;
    (this->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
    _M_extent._M_extent_value = (size_t)pSVar1;
  }
  else {
    if (pSVar5 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar5 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar5 = *ppSVar3;
    }
    (this->left).ptr = (ExpressionSyntax *)pSVar5;
  }
  return;
}

Assistant:

void InvocationExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: left = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: arguments = child.node() ? &child.node()->as<ArgumentListSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}